

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccesscachebackend.cpp
# Opt level: O3

int __thiscall
QNetworkAccessCacheBackend::open(QNetworkAccessCacheBackend *this,char *__file,int __oflag,...)

{
  bool bVar1;
  Operation OVar2;
  long in_FS_OFFSET;
  QAnyStringView QVar3;
  QUrl local_90;
  QArrayData *local_88;
  int local_80;
  QChar local_78;
  QArrayData *local_70 [3];
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  OVar2 = QNetworkAccessBackend::operation((QNetworkAccessBackend *)this);
  if (OVar2 == GetOperation) {
    bVar1 = sendCacheContents(this);
    if (bVar1) {
      QVariant::QVariant((QVariant *)&local_58,true);
      QNetworkAccessBackend::setAttribute
                ((QNetworkAccessBackend *)this,SourceIsFromCacheAttribute,(QVariant *)&local_58);
      QVariant::~QVariant((QVariant *)&local_58);
      goto LAB_0017cc85;
    }
  }
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QCoreApplication::translate((char *)local_70,"QNetworkAccessCacheBackend","Error opening %1",0);
  QNetworkAccessBackend::url((QNetworkAccessBackend *)&local_90);
  QUrl::toString(&local_88,(QNetworkAccessBackend *)&local_90,0);
  QVar3.m_size = (size_t)local_70;
  QVar3.field_0.m_data = &local_58;
  QString::arg_impl(QVar3,local_80,local_78);
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,0x10);
    }
  }
  QUrl::~QUrl(&local_90);
  if (local_70[0] != (QArrayData *)0x0) {
    LOCK();
    (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70[0],2,0x10);
    }
  }
  QNetworkAccessBackend::error
            ((QNetworkAccessBackend *)this,ContentNotFoundError,(QString *)&local_58);
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
LAB_0017cc85:
  QNetworkAccessBackend::finished((QNetworkAccessBackend *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkAccessCacheBackend::open()
{
    if (operation() != QNetworkAccessManager::GetOperation || !sendCacheContents()) {
        QString msg = QCoreApplication::translate("QNetworkAccessCacheBackend", "Error opening %1")
                                                .arg(this->url().toString());
        error(QNetworkReply::ContentNotFoundError, msg);
    } else {
        setAttribute(QNetworkRequest::SourceIsFromCacheAttribute, true);
    }
    finished();
}